

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Expr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::ReadSymbolicExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *this)

{
  StringRef value;
  char cVar1;
  Kind kind;
  int iVar2;
  int iVar3;
  LogicalExpr LVar4;
  Expr condition_00;
  Expr then_expr_00;
  undefined8 *in_RDI;
  Expr else_expr;
  Expr then_expr;
  LogicalExpr condition;
  int opcode;
  TextReader<fmt::Locale> *in_stack_00000030;
  char c;
  int in_stack_00000064;
  NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *in_stack_00000068;
  NLHandler<mp::NullNLHandler<int>,_int> *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *this_01;
  undefined1 in_stack_ffffffffffffffd8 [16];
  undefined7 in_stack_ffffffffffffffe8;
  Expr local_4;
  
  cVar1 = ReaderBase::ReadChar((ReaderBase *)*in_RDI);
  this_01 = in_stack_ffffffffffffffd8._0_8_;
  kind = (Kind)cVar1;
  if (kind == (LAST_LOGICAL_COUNT|PLTERM)) {
    this_00 = (NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2];
    TextReader<fmt::Locale>::ReadString(in_stack_00000030);
    value.size_._0_4_ = in_stack_ffffffffffffffc0;
    value.data_ = (char *)in_RDI;
    value.size_._4_4_ = kind;
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnString(this_00,value);
  }
  else if (kind == (LAST_LOGICAL_COUNT|COUNT)) {
    iVar2 = ReadOpCode((NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *)
                       CONCAT44(0x6f,in_stack_ffffffffffffffc0));
    iVar5 = iVar2;
    iVar3 = mp::expr::nl_opcode(kind);
    if (iVar2 == iVar3) {
      LVar4 = ReadLogicalExpr(this_01);
      condition_00 = ReadSymbolicExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *
                                      )CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      then_expr_00 = ReadSymbolicExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *
                                      )CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnSymbolicIf
                          ((NLHandler<mp::NullNLHandler<int>,_int> *)CONCAT44(iVar5,LVar4),
                           condition_00,then_expr_00,kind);
    }
    else {
      local_4 = ReadNumericExpr(in_stack_00000068,in_stack_00000064);
    }
  }
  else {
    local_4 = ReadNumericExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *)
                              CONCAT17(cVar1,in_stack_ffffffffffffffe8),
                              in_stack_ffffffffffffffd8[0xf],in_stack_ffffffffffffffd8[0xe]);
  }
  return local_4;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}